

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O1

int32 make_mdef_from_list(char *mdeffile,char **CIlist,int32 nciphones,heapelement_t **CDheap,
                         int32 cdheapsize,char *pgm)

{
  uint32 *puVar1;
  int32 iVar2;
  char **ppcVar3;
  char **ppcVar4;
  uint32 *puVar5;
  acmod_id_t aVar6;
  acmod_id_t left_context;
  acmod_id_t right_context;
  word_posn_t posn;
  cmd_ln_t *cmdln;
  char **ppcVar7;
  char *pcVar8;
  heapelement_t *heapel;
  acmod_set_t *acmod_set;
  ulong uVar9;
  FILE *__stream;
  char *fmt;
  int iVar10;
  char **ppcVar11;
  char **ppcVar12;
  size_t n_elem;
  ulong uVar13;
  uint32 uVar14;
  long lVar15;
  uint32 n_tri;
  int32 cdheapsize_local;
  char **local_f8;
  char **local_f0;
  char **local_e8;
  char *local_e0;
  char **local_d8;
  char **local_d0;
  char **local_c8;
  uint32 *local_c0;
  uint32 **local_b8;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  char **local_98;
  char **local_90;
  char **local_88;
  char *local_80;
  uint32 *local_78;
  heapelement_t **CDheap_local;
  char *na_attr [2];
  char *base_attr [2];
  char *filler_attr [2];
  
  ppcVar11 = (char **)(ulong)(uint)nciphones;
  filler_attr[0] = "filler";
  filler_attr[1] = (char *)0x0;
  base_attr[0] = "base";
  base_attr[1] = (char *)0x0;
  na_attr[0] = "n/a";
  na_attr[1] = (char *)0x0;
  cdheapsize_local = cdheapsize;
  local_e0 = mdeffile;
  local_80 = pgm;
  CDheap_local = CDheap;
  cmdln = cmd_ln_get();
  local_a8 = cmd_ln_int_r(cmdln,"-n_state_pm");
  iVar2 = cdheapsize_local;
  uVar9 = (ulong)(uint)cdheapsize_local;
  ppcVar12 = (char **)0x0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x381,"%d n_base, %d n_tri\n",ppcVar11,uVar9);
  local_b0 = (ulong)(uint)(iVar2 + nciphones);
  n_elem = (size_t)(iVar2 + nciphones);
  local_a0 = uVar9;
  ppcVar7 = (char **)__ckd_calloc__(n_elem,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                    ,0x388);
  local_c8 = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x389);
  local_d0 = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x38a);
  local_d8 = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x38b);
  local_c0 = (uint32 *)
             __ckd_calloc__(n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                            ,0x38d);
  local_b8 = (uint32 **)
             __ckd_calloc_2d__(n_elem,(long)(int)local_a8,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                               ,0x38f);
  local_98 = ppcVar11;
  if (0 < nciphones) {
    ppcVar12 = (char **)0x0;
    do {
      pcVar8 = strdup(CIlist[(long)ppcVar12]);
      ppcVar7[(long)ppcVar12] = pcVar8;
      ppcVar12 = (char **)((long)ppcVar12 + 1);
    } while (ppcVar11 != ppcVar12);
  }
  ppcVar4 = local_c8;
  ppcVar3 = local_d0;
  iVar10 = (int)local_a0;
  local_f8 = ppcVar11;
  local_f0 = ppcVar7;
  if (0 < iVar10) {
    local_e8 = local_d8 + (long)ppcVar12;
    lVar15 = 0;
    do {
      heapel = yanktop(&CDheap_local,cdheapsize_local,&cdheapsize_local);
      pcVar8 = strdup(heapel->basephone);
      ppcVar7[(long)ppcVar12 + lVar15] = pcVar8;
      pcVar8 = strdup(heapel->leftcontext);
      ppcVar4[(long)ppcVar12 + lVar15] = pcVar8;
      pcVar8 = strdup(heapel->rightcontext);
      ppcVar3[(long)ppcVar12 + lVar15] = pcVar8;
      pcVar8 = strdup(heapel->wordposition);
      local_e8[lVar15] = pcVar8;
      free_heapelement(heapel);
      lVar15 = lVar15 + 1;
    } while (iVar10 != (int)lVar15);
  }
  uVar9 = local_a0;
  puVar5 = local_c0;
  ppcVar7 = local_f0;
  if (cdheapsize_local == 0) {
    local_e8 = (char **)(local_b0 & 0xffffffff);
    if (0 < (int)local_b0) {
      ppcVar12 = (char **)0x0;
      iVar10 = 0;
      do {
        if (0 < (int)(uint)local_a8) {
          puVar1 = local_b8[(long)ppcVar12];
          uVar13 = 0;
          do {
            puVar1[uVar13] = iVar10 + (int)uVar13;
            uVar13 = uVar13 + 1;
          } while (((uint)local_a8 & 0x7fffffff) != uVar13);
          iVar10 = iVar10 + (int)uVar13;
        }
        ppcVar12 = (char **)((long)ppcVar12 + 1);
      } while (ppcVar12 != local_e8);
    }
    acmod_set = acmod_set_new();
    uVar14 = (uint32)local_98;
    acmod_set_set_n_ci_hint(acmod_set,uVar14);
    acmod_set_set_n_tri_hint(acmod_set,(uint32)uVar9);
    ppcVar12 = (char **)0x0;
    if (0 < (int)uVar14) {
      do {
        ppcVar11 = filler_attr;
        if (*ppcVar7[(long)ppcVar12] != '+') {
          ppcVar11 = base_attr;
        }
        aVar6 = acmod_set_add_ci(acmod_set,ppcVar7[(long)ppcVar12],ppcVar11);
        puVar5[aVar6] = aVar6;
        ppcVar12 = (char **)((long)ppcVar12 + 1);
      } while (local_f8 != ppcVar12);
    }
    ppcVar7 = local_d8;
    if ((int)ppcVar12 < (int)local_b0) {
      uVar9 = (ulong)ppcVar12 & 0xffffffff;
      local_90 = local_d0 + uVar9;
      local_88 = local_c8 + uVar9;
      local_f8 = local_f0 + uVar9;
      local_78 = local_c0 + uVar9;
      local_e8 = (char **)((long)local_e8 - uVar9);
      ppcVar12 = (char **)0x0;
      do {
        aVar6 = acmod_set_name2id(acmod_set,local_f8[(long)ppcVar12]);
        if (aVar6 == 0xffffffff) {
          pcVar8 = local_f8[(long)ppcVar12];
          fmt = "Error in dictionary or phonelist. Bad basephone %s in triphone list!\n";
          lVar15 = 0x3b5;
          goto LAB_00105a7c;
        }
        left_context = acmod_set_name2id(acmod_set,local_88[(long)ppcVar12]);
        if (left_context == 0xffffffff) {
          pcVar8 = local_88[(long)ppcVar12];
          fmt = "Error in dictionary or phonelist. Bad leftphone %s in triphone list!\n";
          lVar15 = 0x3b7;
          goto LAB_00105a7c;
        }
        right_context = acmod_set_name2id(acmod_set,local_90[(long)ppcVar12]);
        if (right_context == 0xffffffff) {
          pcVar8 = local_90[(long)ppcVar12];
          fmt = "Error in dictionary or phonelist. Bad rightphone %s in triphone list!\n";
          lVar15 = 0x3b9;
          goto LAB_00105a7c;
        }
        posn = posnstr2wordpos(ppcVar7[uVar9 + (long)ppcVar12]);
        acmod_set_add_tri(acmod_set,aVar6,left_context,right_context,posn,na_attr);
        local_78[(long)ppcVar12] = aVar6;
        ppcVar12 = (char **)((long)ppcVar12 + 1);
      } while (local_e8 != ppcVar12);
    }
    __stream = fopen(local_e0,"w");
    uVar9 = local_a0;
    ppcVar3 = local_c8;
    ppcVar11 = local_d0;
    ppcVar12 = local_d8;
    ppcVar7 = local_f0;
    if (__stream != (FILE *)0x0) {
      iVar10 = (int)local_a8;
      local_f8 = (char **)(ulong)(iVar10 + 1U);
      uVar14 = (uint32)local_98;
      n_tri = (uint32)local_a0;
      output_model_def((FILE *)__stream,local_80,local_f0,local_c8,local_d0,local_d8,local_c0,
                       local_b8,uVar14,n_tri,(uint32)local_b0,iVar10 + 1U,(uint32)local_b0 * iVar10,
                       iVar10 * uVar14,uVar14);
      fclose(__stream);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x3c9,"Wrote mdef file %s\n",local_e0);
      if (0 < (int)n_tri) {
        uVar13 = 0;
        do {
          pcVar8 = ppcVar7[uVar13];
          if (pcVar8 != (char *)0x0) {
            free(pcVar8);
          }
          pcVar8 = ppcVar3[uVar13];
          if (pcVar8 != (char *)0x0) {
            free(pcVar8);
          }
          pcVar8 = ppcVar11[uVar13];
          if (pcVar8 != (char *)0x0) {
            free(pcVar8);
          }
          pcVar8 = ppcVar12[uVar13];
          if (pcVar8 != (char *)0x0) {
            free(pcVar8);
          }
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
      }
      free(ppcVar7);
      free(ppcVar3);
      free(ppcVar11);
      free(ppcVar12);
      ckd_free_2d(local_b8);
      return 0;
    }
    fmt = "Unable to open %s for writing!\n";
    lVar15 = 0x3c2;
    pcVar8 = local_e0;
LAB_00105a7c:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,lVar15,fmt,pcVar8);
  }
  else {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x39e,"Error in CD heap! Error in dictionary or phone list!\n");
  }
  exit(1);
}

Assistant:

int32 make_mdef_from_list(const char *mdeffile,
			char **CIlist, 
			int32  nciphones,
			heapelement_t **CDheap,
			int32  cdheapsize,
			char  *pgm)
{
    int32  n_base, n_tri, n_state_pm, n_total;
    int32  n_tied_state_ci, n_tied_state_cd, n_tied_tmat;
    char   **base_str, **left_str, **right_str, **posn_str;
    acmod_id_t base, left, right;
    word_posn_t posn;
    acmod_set_t  *acmod_set;
    int32 i,j,k;
    const char *filler_attr[] = {"filler", NULL};
    const char *base_attr[] = {"base", NULL};
    const char *na_attr[] = {"n/a", NULL};
    uint32 *tmat; 
    uint32 **smap;
    heapelement_t *cdphone;
    FILE  *fp;

    n_state_pm = cmd_ln_int32("-n_state_pm") + 1;
    n_base = nciphones;
    n_tri = cdheapsize;
    E_INFO("%d n_base, %d n_tri\n", n_base, n_tri);

    n_tied_state_ci = n_base * (n_state_pm-1);
    n_tied_state_cd = n_tri * (n_state_pm-1);
    n_tied_tmat = n_base;

    n_total = n_base + n_tri;
    base_str = ckd_calloc(n_total, sizeof(char *));
    left_str = ckd_calloc(n_total, sizeof(char *));
    right_str = ckd_calloc(n_total, sizeof(char *));
    posn_str = ckd_calloc(n_total, sizeof(char *));

    tmat = ckd_calloc(n_total, sizeof(uint32));

    smap = (uint32 **)ckd_calloc_2d(n_total, n_state_pm-1, sizeof(uint32));

    for (i = 0; i < n_base; i++) {
        base_str[i] = strdup(CIlist[i]);
    }

    for (j = 0; j < n_tri; j++,i++) {
        cdphone = yanktop(&CDheap,cdheapsize,&cdheapsize);
	base_str[i] = strdup(cdphone->basephone);
	left_str[i] = strdup(cdphone->leftcontext);
	right_str[i] = strdup(cdphone->rightcontext);
	posn_str[i] = strdup(cdphone->wordposition);
	free_heapelement(cdphone);
    }
    if (cdheapsize != 0) 
        E_FATAL("Error in CD heap! Error in dictionary or phone list!\n");

    for (i = 0, k = 0; i < n_total; i++)
        for (j = 0; j < n_state_pm-1; j++)
            smap[i][j] = k++;

    acmod_set = acmod_set_new();

    acmod_set_set_n_ci_hint(acmod_set, n_base);
    acmod_set_set_n_tri_hint(acmod_set, n_tri);

    for (i = 0; i < n_base; i++) {
        if (base_str[i][0] == '+') {
            base = acmod_set_add_ci(acmod_set, base_str[i], filler_attr);
        }
        else {
            base = acmod_set_add_ci(acmod_set, base_str[i], base_attr);
        }
        tmat[base] = base;
    }

    for (; i < n_total; i++) {
        if ((base = acmod_set_name2id(acmod_set, base_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad basephone %s in triphone list!\n",base_str[i]);
        if ((left = acmod_set_name2id(acmod_set, left_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad leftphone %s in triphone list!\n",left_str[i]);
        if ((right = acmod_set_name2id(acmod_set, right_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad rightphone %s in triphone list!\n",right_str[i]);

	posn = posnstr2wordpos(posn_str[i]);

        acmod_set_add_tri(acmod_set, base, left, right, posn, na_attr);
        tmat[i] = base;
    }

    if ((fp = fopen(mdeffile, "w")) == NULL)
        E_FATAL("Unable to open %s for writing!\n",mdeffile);
    output_model_def(fp,
             pgm,
             base_str, left_str, right_str, posn_str, tmat, smap,
             n_base, n_tri, n_total, n_state_pm,
             n_tied_state_ci+n_tied_state_cd, n_tied_state_ci, n_tied_tmat);
    fclose(fp);
    E_INFO("Wrote mdef file %s\n",mdeffile);

    for (j = 0; j < n_tri; j++,i++) {
	if (base_str[j] != NULL) free(base_str[j]);
	if (left_str[j] != NULL) free(left_str[j]);
	if (right_str[j] != NULL) free(right_str[j]);
	if (posn_str[j] != NULL) free(posn_str[j]);
    }
    free(base_str); free(left_str); free(right_str); free(posn_str);
    ckd_free_2d((void**)smap);

    return 0;
}